

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.h
# Opt level: O0

void __thiscall crn_comp_params::clear(crn_comp_params *this)

{
  crn_uint32 l;
  crn_uint32 f;
  crn_comp_params *this_local;
  
  this->m_size_of_obj = 0x378;
  this->m_file_type = cCRNFileTypeCRN;
  this->m_faces = 1;
  this->m_width = 0;
  this->m_height = 0;
  this->m_levels = 1;
  this->m_format = cCRNFmtDXT1;
  this->m_flags = 0xb;
  for (f = 0; f < 6; f = f + 1) {
    for (l = 0; l < 0x10; l = l + 1) {
      this->m_pImages[f][l] = (crn_uint32 *)0x0;
    }
  }
  this->m_target_bitrate = 0.0;
  this->m_quality_level = 0xff;
  this->m_dxt1a_alpha_threshold = 0x80;
  this->m_dxt_quality = cCRNDXTQualityUber;
  this->m_dxt_compressor_type = cCRNDXTCompressorCRN;
  this->m_alpha_component = 3;
  this->m_crn_adaptive_tile_color_psnr_derating = 2.0;
  this->m_crn_adaptive_tile_alpha_psnr_derating = 2.0;
  this->m_crn_color_endpoint_palette_size = 0;
  this->m_crn_color_selector_palette_size = 0;
  this->m_crn_alpha_endpoint_palette_size = 0;
  this->m_crn_alpha_selector_palette_size = 0;
  this->m_num_helper_threads = 0;
  this->m_userdata0 = 1;
  this->m_userdata1 = 0;
  this->m_pProgress_func = (crn_progress_callback_func)0x0;
  this->m_pProgress_func_data = (void *)0x0;
  return;
}

Assistant:

inline void clear() {
    m_size_of_obj = sizeof(*this);
    m_file_type = cCRNFileTypeCRN;
    m_faces = 1;
    m_width = 0;
    m_height = 0;
    m_levels = 1;
    m_format = cCRNFmtDXT1;
    m_flags = cCRNCompFlagPerceptual | cCRNCompFlagHierarchical | cCRNCompFlagUseBothBlockTypes;

    for (crn_uint32 f = 0; f < cCRNMaxFaces; f++)
      for (crn_uint32 l = 0; l < cCRNMaxLevels; l++)
        m_pImages[f][l] = NULL;

    m_target_bitrate = 0.0f;
    m_quality_level = cCRNMaxQualityLevel;
    m_dxt1a_alpha_threshold = 128;
    m_dxt_quality = cCRNDXTQualityUber;
    m_dxt_compressor_type = cCRNDXTCompressorCRN;
    m_alpha_component = 3;

    m_crn_adaptive_tile_color_psnr_derating = 2.0f;
    m_crn_adaptive_tile_alpha_psnr_derating = 2.0f;
    m_crn_color_endpoint_palette_size = 0;
    m_crn_color_selector_palette_size = 0;
    m_crn_alpha_endpoint_palette_size = 0;
    m_crn_alpha_selector_palette_size = 0;

    m_num_helper_threads = 0;
    m_userdata0 = 1;
    m_userdata1 = 0;
    m_pProgress_func = NULL;
    m_pProgress_func_data = NULL;
  }